

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmPostModify(ExpressionContext *ctx,VmModule *module,ExprPostModify *node)

{
  VmValueType VVar1;
  TypeBase *pTVar2;
  VmValue *pVVar3;
  VmValue *lhs;
  VmConstant *pVVar4;
  VmValue *value;
  uint uVar5;
  SynBase *pSVar6;
  uint in_R9D;
  double value_00;
  
  pVVar3 = CompileVm(ctx,module,node->value);
  pTVar2 = node->value->type;
  if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa70,
                  "VmValue *CompileVmPostModify(ExpressionContext &, VmModule *, ExprPostModify *)")
    ;
  }
  lhs = anon_unknown.dwarf_20a43d::CreateLoad
                  (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar2[1]._vptr_TypeBase,
                   pVVar3,in_R9D);
  VVar1 = (lhs->type).type;
  uVar5 = (lhs->type).size;
  if (uVar5 == 4 && VVar1 == VM_TYPE_INT) {
    pSVar6 = (node->super_ExprBase).source;
    pVVar4 = CreateConstantInt(module->allocator,pSVar6,node->isIncrement - 1 | 1);
  }
  else {
    uVar5 = uVar5 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar5 == 0) {
      pSVar6 = (node->super_ExprBase).source;
      if (node->isIncrement == false) {
        value_00 = -1.0;
      }
      else {
        value_00 = 1.0;
      }
      pVVar4 = CreateConstantDouble(module->allocator,pSVar6,value_00);
      value = anon_unknown.dwarf_20a43d::CreateAdd(module,pSVar6,lhs,&pVVar4->super_VmValue);
      goto LAB_0024cba1;
    }
    value = lhs;
    if (VVar1 != VM_TYPE_LONG || uVar5 != 0) goto LAB_0024cba1;
    pSVar6 = (node->super_ExprBase).source;
    pVVar4 = CreateConstantLong(module->allocator,pSVar6,(ulong)node->isIncrement - 1 | 1);
  }
  value = anon_unknown.dwarf_20a43d::CreateAdd(module,pSVar6,lhs,&pVVar4->super_VmValue);
LAB_0024cba1:
  anon_unknown.dwarf_20a43d::CreateStore
            (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar2[1]._vptr_TypeBase,pVVar3,
             value,0);
  pVVar3 = anon_unknown.dwarf_20a43d::CheckType(ctx,&node->super_ExprBase,lhs);
  return pVVar3;
}

Assistant:

VmValue* CompileVmPostModify(ExpressionContext &ctx, VmModule *module, ExprPostModify *node)
{
	VmValue *address = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	VmValue *value = CreateLoad(ctx, module, node->source, refType->subType, address, 0);
	VmValue *result = value;

	if(value->type == VmType::Int)
		value = CreateAdd(module, node->source, value, CreateConstantInt(module->allocator, node->source, node->isIncrement ? 1 : -1));
	else if(value->type == VmType::Double)
		value = CreateAdd(module, node->source, value, CreateConstantDouble(module->allocator, node->source, node->isIncrement ? 1.0 : -1.0));
	else if(value->type == VmType::Long)
		value = CreateAdd(module, node->source, value, CreateConstantLong(module->allocator, node->source, node->isIncrement ? 1ll : -1ll));
	else
		assert("!unknown type");

	CreateStore(ctx, module, node->source, refType->subType, address, value, 0);

	return CheckType(ctx, node, result);
}